

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.cpp
# Opt level: O1

void __thiscall
Centaurus::CompositeATN<unsigned_char>::build_closure_exclusive
          (CompositeATN<unsigned_char> *this,CATNClosure *closure,ATNPath *path,int color,
          ATNStateStack *stack,PriorityChain *priority)

{
  pointer pNVar1;
  pointer ppVar2;
  int iVar3;
  CATNNode<unsigned_char> *pCVar4;
  SimpleException *this_00;
  pointer pNVar5;
  ATNPath dest_path;
  PriorityChain new_priority;
  int local_b4;
  _Rb_tree<Centaurus::CATNClosureElement,Centaurus::CATNClosureElement,std::_Identity<Centaurus::CATNClosureElement>,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>
  *local_b0;
  CompositeATN<unsigned_char> *local_a8;
  ATNStateStack *local_a0;
  PriorityChain *local_98;
  ATNPath local_90;
  vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  *local_70;
  undefined1 local_68 [16];
  _func_int *local_58 [2];
  vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_> local_48
  ;
  
  local_b4 = color;
  local_b0 = (_Rb_tree<Centaurus::CATNClosureElement,Centaurus::CATNClosureElement,std::_Identity<Centaurus::CATNClosureElement>,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>
              *)closure;
  local_a8 = this;
  local_a0 = stack;
  local_98 = priority;
  pCVar4 = get_node(this,path);
  pNVar5 = (pCVar4->m_transitions).
           super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pNVar5 == (pCVar4->m_transitions).
                super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    ATNPath::parent_path(&local_90,path);
    if ((int)((ulong)((long)local_90.
                            super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                            .
                            super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_90.
                           super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                           .
                           super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 == 0) {
      build_wildcard_closure
                (local_a8,(CATNClosure *)local_b0,
                 &(path->
                  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                  ).
                  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].first,local_b4,local_a0,local_98);
    }
    else {
      build_closure_exclusive(local_a8,(CATNClosure *)local_b0,&local_90,local_b4,local_a0,local_98)
      ;
    }
    std::
    vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
    ::~vector(&local_90.
               super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
             );
  }
  else {
    pNVar1 = (pCVar4->m_transitions).
             super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pNVar5 != pNVar1) {
      local_70 = &path->
                  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
      ;
      do {
        if ((pNVar5->m_label).m_ranges.
            super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (pNVar5->m_label).m_ranges.
            super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          iVar3 = pNVar5->m_dest;
          std::
          vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
          ::vector(&local_90.
                    super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                   ,local_70);
          local_90._vptr_ATNPath = (_func_int **)&PTR__ATNPath_001c8f28;
          local_90.
          super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
          .
          super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].second = iVar3;
          pCVar4 = get_node(local_a8,&local_90);
          ppVar2 = (path->
                   super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                   ).
                   super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          PriorityChain::add((PriorityChain *)&local_48,local_98,&ppVar2[-1].first,ppVar2[-1].second
                             ,pNVar5->m_tag);
          if ((pCVar4->m_submachine).m_id._M_string_length == 0) {
            std::
            _Rb_tree<Centaurus::CATNClosureElement,Centaurus::CATNClosureElement,std::_Identity<Centaurus::CATNClosureElement>,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>
            ::_M_emplace_unique<Centaurus::ATNPath&,int&,Centaurus::PriorityChain&>
                      (local_b0,&local_90,&local_b4,(PriorityChain *)&local_48);
            build_closure_exclusive
                      (local_a8,(CATNClosure *)local_b0,&local_90,local_b4,local_a0,
                       (PriorityChain *)&local_48);
          }
          else {
            iVar3 = ATNPath::count(&local_90,
                                   &(path->
                                    super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                                    ).
                                    super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish[-1].first,
                                   pNVar5->m_dest);
            if (1 < iVar3) {
              this_00 = (SimpleException *)__cxa_allocate_exception(0x28);
              local_68._0_8_ = local_58;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_68,"Downward sentinel reached.","");
              SimpleException::SimpleException(this_00,(string *)local_68);
              __cxa_throw(this_00,&SimpleException::typeinfo,SimpleException::~SimpleException);
            }
            ATNPath::add((ATNPath *)local_68,&local_90,&pCVar4->m_submachine,0);
            build_closure_inclusive
                      (local_a8,(CATNClosure *)local_b0,(ATNPath *)local_68,local_b4,local_a0,
                       (PriorityChain *)&local_48);
            std::
            vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
            ::~vector((vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                       *)(local_68 + 8));
          }
          std::
          vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
          ::~vector(&local_48);
          std::
          vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
          ::~vector(&local_90.
                     super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                   );
        }
        pNVar5 = pNVar5 + 1;
      } while (pNVar5 != pNVar1);
    }
  }
  return;
}

Assistant:

void CompositeATN<TCHAR>::build_closure_exclusive(CATNClosure& closure, const ATNPath& path, int color, ATNStateStack& stack, const PriorityChain& priority) const
{
    const CATNNode<TCHAR>& node = get_node(path);

    //std::wcout << L"Exclusive " << path << L":" << color << std::endl;

    if (node.is_stop_node())
    {
        //std::wcout << L"Stop node " << path << std::endl;

        ATNPath parent = path.parent_path();

        if (parent.depth() == 0)
        {
            build_wildcard_closure(closure, path.leaf_id(), color, stack, priority);
        }
        else
        {
            build_closure_exclusive(closure, parent, color, stack, priority);
        }
    }
    else
    {
        //std::wcout << L"Intermediate node " << path << std::endl;

        for (const auto& tr : node.get_transitions())
        {
            if (tr.is_epsilon())
            {
                ATNPath dest_path = path.replace_index(tr.dest());

                const CATNNode<TCHAR>& dest_node = get_node(dest_path);

                PriorityChain new_priority = priority.add(path.leaf_id(), path.leaf_index(), tr.tag());

                if (dest_node.is_terminal())
                {
                    closure.emplace(dest_path, color, new_priority);

                    build_closure_exclusive(closure, dest_path, color, stack, new_priority);
                }
                else
                {
                    if (dest_path.count(path.leaf_id(), tr.dest()) >= 2)
                    {
                        throw SimpleException("Downward sentinel reached.");
                    }

                    build_closure_inclusive(closure, dest_path.add(dest_node.get_submachine(), 0), color, stack, new_priority);
                }
            }
        }
    }
}